

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O0

bool __thiscall libDAI::JTree::initProps(JTree *this)

{
  bool bVar1;
  unsigned_long uVar2;
  allocator<char> *in_RDI;
  InferenceAlgorithm *in_stack_fffffffffffffef8;
  InferenceAlgorithm *in_stack_ffffffffffffff00;
  InferenceAlgorithm *this_00;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [32];
  value local_70;
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [47];
  bool local_1;
  
  __s = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff40,(char *)__s,in_RDI);
  bVar1 = InferenceAlgorithm::HasProperty
                    (in_stack_ffffffffffffff00,(PropertyKey *)in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff40,(char *)__s,in_RDI)
    ;
    bVar1 = InferenceAlgorithm::HasProperty
                      (in_stack_ffffffffffffff00,(PropertyKey *)in_stack_fffffffffffffef8);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff40,(char *)__s,in_RDI);
      local_70 = (value)InferenceAlgorithm::FromStringTo<libDAI::JTree::UpdateType>
                                  (in_stack_fffffffffffffef8,(PropertyKey *)0xb61c24);
      *(value *)(in_RDI + 0x1e8) = local_70;
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator(&local_91);
      this_00 = (InferenceAlgorithm *)&stack0xffffffffffffff47;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff40,(char *)__s,in_RDI);
      uVar2 = InferenceAlgorithm::FromStringTo<unsigned_long>
                        (this_00,(PropertyKey *)in_stack_fffffffffffffef8);
      *(unsigned_long *)(in_RDI + 0x1f0) = uVar2;
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool JTree::initProps() {
        if( !HasProperty("updates") )
            return false;
        if( !HasProperty("verbose") )
            return false;
        
        Props.updates = FromStringTo<UpdateType>("updates");
        Props.verbose = FromStringTo<size_t>("verbose");

        return true;
    }